

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_messaging_ll.c
# Opt level: O1

int addApplicationPropertiesToAMQPMessage
              (IOTHUB_MESSAGE_HANDLE iothub_message_handle,MESSAGE_HANDLE uamqp_message)

{
  MAP_RESULT MVar1;
  int iVar2;
  MAP_HANDLE handle;
  AMQP_VALUE map;
  AMQP_VALUE key;
  AMQP_VALUE value;
  LOGGER_LOG p_Var3;
  int iVar4;
  char *pcVar5;
  ulong uVar6;
  size_t propertyCount;
  char **propertyValues;
  char **propertyKeys;
  size_t local_48;
  char **local_40;
  char **local_38;
  
  local_48 = 0;
  handle = IoTHubMessage_Properties(iothub_message_handle);
  MVar1 = Map_GetInternals(handle,&local_38,&local_40,&local_48);
  if (MVar1 != MAP_OK) {
    p_Var3 = xlogging_get_log_function();
    iVar2 = 0x152;
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return 0x152;
    }
    pcVar5 = "Failed to get the internals of the property map.";
    iVar4 = 0x151;
LAB_00131854:
    (*p_Var3)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
              ,"addApplicationPropertiesToAMQPMessage",iVar4,1,pcVar5);
    return iVar2;
  }
  if (local_48 == 0) {
    return 0;
  }
  map = amqpvalue_create_map();
  if (map == (AMQP_VALUE)0x0) {
    p_Var3 = xlogging_get_log_function();
    iVar2 = 0x15d;
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return 0x15d;
    }
    pcVar5 = "Failed to create uAMQP map for the properties.";
    iVar4 = 0x15c;
    goto LAB_00131854;
  }
  if (local_48 == 0) {
    uVar6 = 0;
  }
  else {
    uVar6 = 0;
    do {
      key = amqpvalue_create_string(local_38[uVar6]);
      if (key == (AMQP_VALUE)0x0) {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          pcVar5 = "Failed to create uAMQP property key name.";
          iVar2 = 0x169;
LAB_0013192a:
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                    ,"addApplicationPropertiesToAMQPMessage",iVar2,1,pcVar5);
        }
        break;
      }
      value = amqpvalue_create_string(local_40[uVar6]);
      if (value == (AMQP_VALUE)0x0) {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          pcVar5 = "Failed to create uAMQP property key value.";
          iVar2 = 0x170;
          goto LAB_0013192a;
        }
        break;
      }
      iVar2 = amqpvalue_set_map_value(map,key,value);
      if (iVar2 != 0) {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          pcVar5 = "Failed to set key/value into the the uAMQP property map.";
          iVar2 = 0x177;
          goto LAB_0013192a;
        }
        break;
      }
      amqpvalue_destroy(value);
      amqpvalue_destroy(key);
      uVar6 = uVar6 + 1;
    } while (uVar6 < local_48);
  }
  if (uVar6 == local_48) {
    iVar2 = message_set_application_properties(uamqp_message,map);
    if (iVar2 == 0) {
      iVar2 = 0;
      goto LAB_001319b7;
    }
    p_Var3 = xlogging_get_log_function();
    iVar2 = 0x185;
    if (p_Var3 == (LOGGER_LOG)0x0) goto LAB_001319b7;
    pcVar5 = "Failed to transfer the message properties to the uAMQP message.";
    iVar4 = 0x184;
  }
  else {
    p_Var3 = xlogging_get_log_function();
    iVar2 = 399;
    if (p_Var3 == (LOGGER_LOG)0x0) goto LAB_001319b7;
    pcVar5 = "Failed to set application property into the the uAMQP property map.";
    iVar4 = 0x18e;
  }
  (*p_Var3)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
            ,"addApplicationPropertiesToAMQPMessage",iVar4,1,pcVar5);
LAB_001319b7:
  amqpvalue_destroy(map);
  return iVar2;
}

Assistant:

static int addApplicationPropertiesToAMQPMessage(IOTHUB_MESSAGE_HANDLE iothub_message_handle, MESSAGE_HANDLE uamqp_message)
{
    int result;
    MAP_HANDLE properties_map;
    const char* const* propertyKeys;
    const char* const* propertyValues;
    size_t propertyCount = 0;

    properties_map = IoTHubMessage_Properties(iothub_message_handle);

    if (Map_GetInternals(properties_map, &propertyKeys, &propertyValues, &propertyCount) != MAP_OK)
    {
        LogError("Failed to get the internals of the property map.");
        result = MU_FAILURE;
    }
    else
    {
        if (propertyCount != 0)
        {
            AMQP_VALUE uamqp_map;

            if ((uamqp_map = amqpvalue_create_map()) == NULL)
            {
                LogError("Failed to create uAMQP map for the properties.");
                result = MU_FAILURE;
            }
            else
            {
                size_t i = 0;
                for (i = 0; i < propertyCount; i++)
                {
                    AMQP_VALUE map_key_value = NULL;
                    AMQP_VALUE map_value_value = NULL;

                    if ((map_key_value = amqpvalue_create_string(propertyKeys[i])) == NULL)
                    {
                        LogError("Failed to create uAMQP property key name.");
                        break;
                    }
                    else
                    {
                        if ((map_value_value = amqpvalue_create_string(propertyValues[i])) == NULL)
                        {
                            LogError("Failed to create uAMQP property key value.");
                            break;
                        }
                        else
                        {
                            if (amqpvalue_set_map_value(uamqp_map, map_key_value, map_value_value) != 0)
                            {
                                LogError("Failed to set key/value into the the uAMQP property map.");
                                break;
                            }
                            amqpvalue_destroy(map_value_value);
                        }
                        amqpvalue_destroy(map_key_value);
                    }
                }

                if (i == propertyCount)
                {
                    if (message_set_application_properties(uamqp_message, uamqp_map) != 0)
                    {
                        LogError("Failed to transfer the message properties to the uAMQP message.");
                        result = MU_FAILURE;
                    }
                    else
                    {
                        result = 0;
                    }
                }
                else
                {
                    LogError("Failed to set application property into the the uAMQP property map.");
                    result = MU_FAILURE;
                }
                amqpvalue_destroy(uamqp_map);
            }
        }
        else
        {
            result = 0;
        }
    }
    return result;
}